

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMMemTest.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  uint uVar2;
  char *__s;
  
  iVar1 = 3;
  do {
    mymain();
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  uVar2 = (uint)errorOccurred;
  __s = "Test Run Successfully";
  if (uVar2 != 0) {
    __s = "Test Failed";
  }
  puts(__s);
  return uVar2 << 2;
}

Assistant:

int  main() {
   for (int i = 0; i<3; i++)
        mymain();

    if (errorOccurred) {
        printf("Test Failed\n");
        return 4;
    }

    printf("Test Run Successfully\n");

    return 0;
}